

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyImplementations.h
# Opt level: O2

void __thiscall iDynTree::DummyLight::~DummyLight(DummyLight *this)

{
  ~DummyLight(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~DummyLight() {}